

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O3

bool __thiscall
wasm::SmallVector<wasm::Literal,_1UL>::operator==
          (SmallVector<wasm::Literal,_1UL> *this,SmallVector<wasm::Literal,_1UL> *other)

{
  pointer pLVar1;
  char cVar2;
  Literal *pLVar3;
  ulong uVar4;
  pointer pLVar5;
  Literal *this_00;
  pointer this_01;
  
  if (this->usedFixed != other->usedFixed) {
    return false;
  }
  if (this->usedFixed != 0) {
    this_00 = (this->fixed)._M_elems;
    pLVar3 = (other->fixed)._M_elems;
    uVar4 = 0;
    do {
      cVar2 = wasm::Literal::operator!=(this_00,pLVar3);
      if (cVar2 != '\0') goto LAB_001cba21;
      uVar4 = uVar4 + 1;
      this_00 = this_00 + 1;
      pLVar3 = pLVar3 + 1;
    } while (uVar4 < this->usedFixed);
  }
  this_01 = (this->flexible).super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pLVar1 = (this->flexible).super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pLVar5 = (other->flexible).super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((long)pLVar1 - (long)this_01 ==
      (long)(other->flexible).super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
            _M_impl.super__Vector_impl_data._M_finish - (long)pLVar5) {
    if (this_01 == pLVar1) {
      cVar2 = '\x01';
    }
    else {
      do {
        cVar2 = wasm::Literal::operator==(this_01,pLVar5);
        if (cVar2 == '\0') {
          return false;
        }
        this_01 = this_01 + 1;
        pLVar5 = pLVar5 + 1;
      } while (this_01 != pLVar1);
    }
  }
  else {
LAB_001cba21:
    cVar2 = '\0';
  }
  return (bool)cVar2;
}

Assistant:

bool operator==(const SmallVector<T, N>& other) const {
    if (usedFixed != other.usedFixed) {
      return false;
    }
    for (size_t i = 0; i < usedFixed; i++) {
      if (fixed[i] != other.fixed[i]) {
        return false;
      }
    }
    return flexible == other.flexible;
  }